

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O0

void absl::lts_20240722::
     call_once<void(absl::lts_20240722::flags_internal::FlagImpl::*)(),absl::lts_20240722::flags_internal::FlagImpl*>
               (once_flag *flag,offset_in_FlagImpl_to_subr *fn,FlagImpl **args)

{
  Nonnull<std::atomic<uint32_t>_*> control;
  uint32_t s;
  atomic<unsigned_int> *once;
  FlagImpl **args_local;
  offset_in_FlagImpl_to_subr *fn_local;
  once_flag *flag_local;
  memory_order __b;
  
  control = base_internal::ControlWord(flag);
  std::operator&(memory_order_acquire,__memory_order_mask);
  if ((control->super___atomic_base<unsigned_int>)._M_i != 0xdd) {
    base_internal::
    CallOnceImpl<void(absl::lts_20240722::flags_internal::FlagImpl::*)(),absl::lts_20240722::flags_internal::FlagImpl*>
              (control,SCHEDULE_COOPERATIVE_AND_KERNEL,fn,args);
  }
  return;
}

Assistant:

void call_once(absl::once_flag& flag, Callable&& fn, Args&&... args) {
  std::atomic<uint32_t>* once = base_internal::ControlWord(&flag);
  uint32_t s = once->load(std::memory_order_acquire);
  if (ABSL_PREDICT_FALSE(s != base_internal::kOnceDone)) {
    base_internal::CallOnceImpl(
        once, base_internal::SCHEDULE_COOPERATIVE_AND_KERNEL,
        std::forward<Callable>(fn), std::forward<Args>(args)...);
  }
}